

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvmapImage.cpp
# Opt level: O2

void __thiscall EnvmapImage::resize(EnvmapImage *this,Envmap type,Box2i *dataWindow)

{
  Imf_3_4::Array2D<Imf_3_4::Rgba>::resizeEraseUnsafe
            (&this->_pixels,(long)(((dataWindow->max).y - (dataWindow->min).y) + 1),
             (long)(((dataWindow->max).x - (dataWindow->min).x) + 1));
  this->_type = type;
  (this->_dataWindow).min = dataWindow->min;
  (this->_dataWindow).max = dataWindow->max;
  clear(this);
  return;
}

Assistant:

void
EnvmapImage::resize (Envmap type, const Box2i& dataWindow)
{
    _pixels.resizeEraseUnsafe (
        dataWindow.max.y - dataWindow.min.y + 1,
        dataWindow.max.x - dataWindow.min.x + 1);
    _type       = type;
    _dataWindow = dataWindow;

    clear ();
}